

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_lambda.cpp
# Opt level: O1

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseLambda(Parser *this)

{
  __uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_> _Var1;
  Token *pTVar2;
  size_t sVar3;
  Lexer *pLVar4;
  pointer pcVar5;
  size_t sVar6;
  size_t sVar7;
  istream *piVar8;
  _func_int ***ppp_Var9;
  undefined8 uVar10;
  bool bVar11;
  bool bVar12;
  tuple<pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_> this_00;
  Lexer *pLVar13;
  Parser *in_RSI;
  pointer __p_1;
  pointer __p;
  unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> body;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> expr;
  Exprs params;
  undefined1 local_b0 [24];
  Exprs local_98;
  undefined1 local_80 [32];
  __uniq_ptr_impl<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> local_60 [3];
  __uniq_ptr_impl<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_> local_48;
  undefined1 local_40 [16];
  
  sanityExpect(in_RSI,TOK_KW_LAMBDA);
  local_80._8_8_ = (_Base_ptr)0x0;
  local_80._16_8_ = (_Base_ptr)0x0;
  local_80._24_8_ = (pointer)0x0;
  bVar11 = Token::operator==(in_RSI->lexer->currentToken,TOK_OP_BRACKET_OPEN);
  if (bVar11) {
    Lexer::next(in_RSI->lexer);
    parseExpression((Parser *)local_b0,(Precedence)in_RSI);
    if ((Expr *)local_b0._0_8_ == (Expr *)0x0) {
      bVar11 = true;
    }
    else {
      if (*(int *)&(((string *)(local_b0._0_8_ + 0x18))->_M_dataplus)._M_p == 0x12) {
        do {
          uVar10 = local_b0._0_8_;
          if (*(_func_int ***)local_b0._0_8_ != (_func_int **)&PTR__BiOpExpr_00128998) {
            __cxa_bad_cast();
          }
          if ((short)((Position *)&((Expr *)(local_b0._0_8_ + 0x38))->parent)->line != 0x2e) break;
          if (*(_func_int ***)local_b0._0_8_ != (_func_int **)&PTR__BiOpExpr_00128998) {
            __cxa_bad_cast();
          }
          local_98.
          super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               *(pointer *)&((Expr *)(local_b0._0_8_ + 0x38))->type;
          *(size_t *)&((Expr *)(local_b0._0_8_ + 0x38))->type = 0;
          std::
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ::_M_insert_rval((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                            *)(local_80 + 8),(const_iterator)local_80._8_8_,(value_type *)&local_98)
          ;
          if ((Error<pfederc::SyntaxErrorCode> *)
              local_98.
              super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (Error<pfederc::SyntaxErrorCode> *)0x0) {
            (**(code **)(*(long *)&(local_98.
                                    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t + 8))();
          }
          _Var1._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
          super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
               (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)
               ((Expr *)(uVar10 + 0x38))->lexer;
          ((Expr *)(uVar10 + 0x38))->lexer = (Lexer *)0x0;
          if ((tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_b0._0_8_ !=
              (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
            ppp_Var9 = (_func_int ***)local_b0._0_8_;
            local_b0._0_8_ =
                 _Var1._M_t.
                 super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                 super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
            (*(*ppp_Var9)[1])();
            _Var1._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
            super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
                 (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)
                 (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)local_b0._0_8_;
          }
          local_b0._0_8_ =
               _Var1._M_t.
               super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
               super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
        } while (*(int *)&(((string *)(local_b0._0_8_ + 0x18))->_M_dataplus)._M_p == 0x12);
      }
      std::
      vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ::_M_insert_rval((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                        *)(local_80 + 8),(const_iterator)local_80._8_8_,(value_type *)local_b0);
      bVar11 = false;
    }
    bVar12 = expect(in_RSI,TOK_BRACKET_CLOSE);
    if (!bVar12) {
      pTVar2 = in_RSI->lexer->currentToken;
      local_98.
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x38);
      sVar6 = (pTVar2->pos).line;
      sVar7 = (pTVar2->pos).startIndex;
      sVar3 = (pTVar2->pos).endIndex;
      ((Error<pfederc::SyntaxErrorCode> *)
      local_98.
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->logLevel = LVL_ERROR;
      ((Error<pfederc::SyntaxErrorCode> *)
      local_98.
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->err = STX_ERR_EXPECTED_CLOSING_BRACKET;
      (((Error<pfederc::SyntaxErrorCode> *)
       local_98.
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->pos).line = sVar6;
      (((Error<pfederc::SyntaxErrorCode> *)
       local_98.
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->pos).startIndex = sVar7;
      (((Error<pfederc::SyntaxErrorCode> *)
       local_98.
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->pos).endIndex = sVar3;
      (((Error<pfederc::SyntaxErrorCode> *)
       local_98.
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->extraPos).
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((Error<pfederc::SyntaxErrorCode> *)
       local_98.
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->extraPos).
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (((Error<pfederc::SyntaxErrorCode> *)
       local_98.
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->extraPos).
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generateError((Parser *)(local_40 + 8),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_40 + 8));
      if ((Error<pfederc::SyntaxErrorCode> *)
          local_98.
          super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (Error<pfederc::SyntaxErrorCode> *)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_98,
                   (Error<pfederc::SyntaxErrorCode> *)
                   local_98.
                   super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar11 = true;
    }
    if ((_Head_base<0UL,_pfederc::Expr_*,_false>)local_b0._0_8_ !=
        (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
      (*(*(_func_int ***)local_b0._0_8_)[1])();
    }
  }
  else {
    bVar11 = false;
  }
  bVar12 = Token::operator==(in_RSI->lexer->currentToken,TOK_OP_ASG);
  if (!bVar12) {
    bVar12 = expect(in_RSI,TOK_EOL);
    if (!bVar12) {
      pTVar2 = in_RSI->lexer->currentToken;
      local_b0._0_8_ = operator_new(0x38);
      sVar3 = (pTVar2->pos).line;
      piVar8 = (istream *)(pTVar2->pos).startIndex;
      pcVar5 = (pointer)(pTVar2->pos).endIndex;
      *(Level *)&((Lexer *)local_b0._0_8_)->_vptr_Lexer = LVL_ERROR;
      *(SyntaxErrorCode *)((long)&((Lexer *)local_b0._0_8_)->_vptr_Lexer + 4) = STX_ERR_EXPECTED_EOL
      ;
      ((Position *)&((Lexer *)local_b0._0_8_)->cfg)->line = sVar3;
      ((Lexer *)local_b0._0_8_)->input = piVar8;
      (((Lexer *)local_b0._0_8_)->filePath)._M_dataplus._M_p = pcVar5;
      (((Lexer *)local_b0._0_8_)->filePath)._M_string_length = 0;
      (((Lexer *)local_b0._0_8_)->filePath).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(((Lexer *)local_b0._0_8_)->filePath).field_2 + 8) = 0;
      generateError((Parser *)(local_60 + 2),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_60 + 2));
      if ((Expr *)local_b0._0_8_ != (Expr *)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_b0,
                   (Error<pfederc::SyntaxErrorCode> *)local_b0._0_8_);
      }
      bVar11 = true;
    }
    parseFunctionBody((Parser *)local_b0);
    if ((Expr *)local_b0._0_8_ == (Expr *)0x0) {
      bVar11 = true;
    }
    bVar12 = expect(in_RSI,TOK_STMT);
    if (!bVar12) {
      pTVar2 = in_RSI->lexer->currentToken;
      local_98.
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x38);
      sVar6 = (pTVar2->pos).line;
      sVar7 = (pTVar2->pos).startIndex;
      sVar3 = (pTVar2->pos).endIndex;
      ((Error<pfederc::SyntaxErrorCode> *)
      local_98.
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->logLevel = LVL_ERROR;
      ((Error<pfederc::SyntaxErrorCode> *)
      local_98.
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)->err = STX_ERR_EXPECTED_STMT;
      (((Error<pfederc::SyntaxErrorCode> *)
       local_98.
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->pos).line = sVar6;
      (((Error<pfederc::SyntaxErrorCode> *)
       local_98.
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->pos).startIndex = sVar7;
      (((Error<pfederc::SyntaxErrorCode> *)
       local_98.
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->pos).endIndex = sVar3;
      (((Error<pfederc::SyntaxErrorCode> *)
       local_98.
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->extraPos).
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (((Error<pfederc::SyntaxErrorCode> *)
       local_98.
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->extraPos).
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (((Error<pfederc::SyntaxErrorCode> *)
       local_98.
       super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->extraPos).
      super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generateError((Parser *)(local_60 + 1),
                    (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                     *)in_RSI);
      std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                 (local_60 + 1));
      if ((Error<pfederc::SyntaxErrorCode> *)
          local_98.
          super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (Error<pfederc::SyntaxErrorCode> *)0x0) {
        std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                  ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_98,
                   (Error<pfederc::SyntaxErrorCode> *)
                   local_98.
                   super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar11 = true;
    }
    uVar10 = local_b0._0_8_;
    if (bVar11) {
      this->lexer = (Lexer *)0x0;
    }
    else {
      pLVar4 = in_RSI->lexer;
      pLVar13 = (Lexer *)operator_new(0x58);
      LambdaExpr::LambdaExpr
                ((LambdaExpr *)pLVar13,pLVar4,(Position *)(uVar10 + 0x20),(Exprs *)(local_80 + 8),
                 (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_b0)
      ;
      local_98.
      super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      this->lexer = pLVar13;
      std::unique_ptr<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_>::~unique_ptr
                ((unique_ptr<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_> *)
                 &local_98);
    }
    std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_b0);
    goto LAB_00114f26;
  }
  Lexer::next(in_RSI->lexer);
  parseExpression((Parser *)local_80,(Precedence)in_RSI);
  uVar10 = local_80._0_8_;
  if ((Lexer *)local_80._0_8_ == (Lexer *)0x0) {
    pTVar2 = in_RSI->lexer->currentToken;
    local_b0._0_8_ = operator_new(0x38);
    sVar3 = (pTVar2->pos).line;
    piVar8 = (istream *)(pTVar2->pos).startIndex;
    pcVar5 = (pointer)(pTVar2->pos).endIndex;
    *(undefined2 *)local_b0._0_8_ = 2;
    *(SyntaxErrorCode *)(local_b0._0_8_ + 4) = STX_ERR_EXPECTED_EXPR;
    ((Position *)(local_b0._0_8_ + 8))->line = sVar3;
    *(istream **)(local_b0._0_8_ + 0x10) = piVar8;
    (((string *)(local_b0._0_8_ + 0x18))->_M_dataplus)._M_p = pcVar5;
    (((vector<pfederc::Position,_std::allocator<pfederc::Position>_> *)(local_b0._0_8_ + 0x20))->
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(local_b0._0_8_ + 0x28))->_M_allocated_capacity = 0;
    *(pointer *)(local_b0._0_8_ + 0x30) = (pointer)0x0;
    generateError((Parser *)local_40,
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)in_RSI);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)local_40)
    ;
    if ((_Head_base<0UL,_pfederc::Expr_*,_false>)local_b0._0_8_ !=
        (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_b0,
                 (Error<pfederc::SyntaxErrorCode> *)local_b0._0_8_);
    }
LAB_00114f0f:
    this->lexer = (Lexer *)0x0;
  }
  else {
    if (bVar11) goto LAB_00114f0f;
    local_b0._0_8_ = ((Position *)(local_80._0_8_ + 0x20))->line;
    local_b0._8_8_ =
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)&((Position *)(local_80._0_8_ + 0x20))->startIndex)->_M_allocated_capacity;
    local_b0._16_8_ = ((Position *)(local_80._0_8_ + 0x20))->endIndex;
    pLVar4 = in_RSI->lexer;
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00.super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
    super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>)
         operator_new(0x60);
    BodyExpr::BodyExpr((BodyExpr *)
                       this_00.
                       super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>
                       .super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl,pLVar4,
                       (Position *)(uVar10 + 0x20),&local_98,
                       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_80,
                       RETURN);
    local_60[0]._M_t.
    super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
    super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl =
         (tuple<pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>)
         (tuple<pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>)
         this_00.
         super__Tuple_impl<0UL,_pfederc::BodyExpr_*,_std::default_delete<pfederc::BodyExpr>_>.
         super__Head_base<0UL,_pfederc::BodyExpr_*,_false>._M_head_impl;
    pLVar13 = (Lexer *)operator_new(0x58);
    LambdaExpr::LambdaExpr
              ((LambdaExpr *)pLVar13,pLVar4,(Position *)local_b0,(Exprs *)(local_80 + 8),
               (unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_60);
    local_48._M_t.
    super__Tuple_impl<0UL,_pfederc::LambdaExpr_*,_std::default_delete<pfederc::LambdaExpr>_>.
    super__Head_base<0UL,_pfederc::LambdaExpr_*,_false>._M_head_impl =
         (tuple<pfederc::LambdaExpr_*,_std::default_delete<pfederc::LambdaExpr>_>)
         (_Tuple_impl<0UL,_pfederc::LambdaExpr_*,_std::default_delete<pfederc::LambdaExpr>_>)0x0;
    this->lexer = pLVar13;
    std::unique_ptr<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::LambdaExpr,_std::default_delete<pfederc::LambdaExpr>_> *)
               &local_48);
    std::unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::BodyExpr,_std::default_delete<pfederc::BodyExpr>_> *)local_60);
    std::
    vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
    ::~vector(&local_98);
  }
  if ((Lexer *)local_80._0_8_ != (Lexer *)0x0) {
    (*(*(_func_int ***)local_80._0_8_)[1])();
  }
LAB_00114f26:
  std::
  vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  ::~vector((vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
             *)(local_80 + 8));
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseLambda() noexcept {
  sanityExpect(TokenType::TOK_KW_LAMBDA);

  bool err = false;

  Exprs params;
  if (*lexer.getCurrentToken() == TokenType::TOK_OP_BRACKET_OPEN) {
    lexer.next();

    std::unique_ptr<Expr> paramexpr(parseExpression());
    if (!paramexpr) {
      err = true;
    } else {
      while (isBiOpExpr(*paramexpr, TokenType::TOK_OP_COMMA)) {
        BiOpExpr& biopexpr = dynamic_cast<BiOpExpr&>(*paramexpr);
        params.insert(params.begin(), biopexpr.getRightPtr());
        paramexpr = biopexpr.getLeftPtr();
      }

      params.insert(params.begin(), std::move(paramexpr));
    }

    if (!expect(TokenType::TOK_BRACKET_CLOSE)) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_CLOSING_BRACKET, lexer.getCurrentToken()->getPosition()));
      err = true;
    }
  }

  if (*lexer.getCurrentToken() == TokenType::TOK_OP_ASG) {
    // *=* *expr*
    lexer.next(); // eat =

    std::unique_ptr<Expr> expr(parseExpression());
    if (!expr) {
      generateError(std::make_unique<SyntaxError>(LVL_ERROR,
        SyntaxErrorCode::STX_ERR_EXPECTED_EXPR, lexer.getCurrentToken()->getPosition()));
      return nullptr;
    }

    if (err)
      return nullptr;

    Position pos(expr->getPosition());

    return std::make_unique<LambdaExpr>(lexer, pos,
      std::move(params), std::make_unique<BodyExpr>(lexer,
        expr->getPosition(),
        Exprs(), std::move(expr), ReturnControlType::RETURN));
  }
  // *newline* *body* *;*
  if (!expect(TokenType::TOK_EOL)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EOL, lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  std::unique_ptr<BodyExpr> body(parseFunctionBody());
  if (!body)
    err = true;

  if (!expect(TokenType::TOK_STMT)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_STMT, lexer.getCurrentToken()->getPosition()));
    err = true;
  }

  if (err)
    return nullptr;

  return std::make_unique<LambdaExpr>(lexer, body->getPosition(),
    std::move(params), std::move(body));
}